

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O1

int Amap_LibertyCellIsFlop(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Amap_Pair_t AVar4;
  int iVar5;
  size_t __n;
  Amap_Item_t *pAVar6;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if (iVar2 <= (int)uVar1) {
LAB_003c2eef:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapLiberty.c"
                  ,0x49,"Amap_Item_t *Amap_LibertyItem(Amap_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    pAVar6 = (Amap_Item_t *)0x0;
  }
  else {
    pAVar6 = p->pItems + uVar1;
  }
  if (pAVar6 != (Amap_Item_t *)0x0) {
    pcVar3 = p->pContents;
    do {
      AVar4 = pAVar6->Key;
      __n = (long)AVar4 - ((long)AVar4 << 0x20) >> 0x20;
      iVar5 = strncmp(pcVar3 + AVar4.Beg,"ff",__n);
      if (iVar5 == 0) {
        return 1;
      }
      iVar5 = strncmp(pcVar3 + AVar4.Beg,"latch",__n);
      if (iVar5 == 0) {
        return 1;
      }
      uVar1 = pAVar6->Next;
      if (iVar2 <= (int)uVar1) goto LAB_003c2eef;
      if ((int)uVar1 < 0) {
        pAVar6 = (Amap_Item_t *)0x0;
      }
      else {
        pAVar6 = p->pItems + uVar1;
      }
    } while (pAVar6 != (Amap_Item_t *)0x0);
  }
  return 0;
}

Assistant:

int Amap_LibertyCellIsFlop( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pAttr;
    Amap_ItemForEachChild( p, pCell, pAttr )
        if ( !Amap_LibertyCompare(p, pAttr->Key, "ff") ||
             !Amap_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}